

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O3

void __thiscall
ObjectFactorySystem::CompleteConstructorSwap
          (ObjectFactorySystem *this,ProtectedObjectSwapper *swapper)

{
  IObjectConstructor *pIVar1;
  byte bVar2;
  long lVar3;
  IObject *pObject;
  ulong uVar4;
  pointer ppIVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  undefined8 *puVar8;
  pointer ppIVar9;
  char *pcVar10;
  ICompilerLogger *pIVar11;
  ulong uVar12;
  ulong uVar13;
  
  bVar2 = (swapper->super_RuntimeProtector).m_bHashadException;
  if (((bool)bVar2 != true) || (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) {
    pIVar11 = this->m_pLogger;
    if (pIVar11 != (ICompilerLogger *)0x0) {
      (**(code **)(*(long *)pIVar11 + 0x10))(pIVar11,"Object swap completed\n");
      bVar2 = (swapper->super_RuntimeProtector).m_bHashadException;
    }
    if ((((bVar2 & 1) != 0) && (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) &&
       (pIVar11 = this->m_pLogger, pIVar11 != (ICompilerLogger *)0x0)) {
      (*(code *)**(undefined8 **)pIVar11)
                (pIVar11,"Exception during object destruction of old objects, leaking.\n");
    }
    goto LAB_001133a5;
  }
  pIVar11 = this->m_pLogger;
  if (pIVar11 == (ICompilerLogger *)0x0) goto switchD_00113247_default;
  (*(code *)**(undefined8 **)pIVar11)
            (pIVar11,"Exception during object swapping, switching back to previous objects.\n");
  switch(swapper->m_ProtectedPhase) {
  case PHASE_NONE:
    goto switchD_00113247_default;
  case PHASE_SERIALIZEOUT:
    pIVar11 = this->m_pLogger;
    puVar8 = *(undefined8 **)pIVar11;
    pcVar10 = "\tError occured during serialize out old objects phase.\n";
    break;
  case PHASE_CONSTRUCTNEW:
    pIVar11 = this->m_pLogger;
    puVar8 = *(undefined8 **)pIVar11;
    pcVar10 = "\tError occured during constructing new objects phase.\n";
    break;
  case PHASE_SERIALIZEIN:
    pIVar11 = this->m_pLogger;
    puVar8 = *(undefined8 **)pIVar11;
    pcVar10 = "\tError occured during serialize into the new objects phase.\n";
    break;
  case PHASE_AUTOCONSTRUCTSINGLETONS:
    pIVar11 = this->m_pLogger;
    puVar8 = *(undefined8 **)pIVar11;
    pcVar10 = "\tError occured during auto construct singletons phase.\n";
    break;
  case PHASE_INITANDSERIALIZEOUTTEST:
    if (this->m_bTestSerialization == true) {
      pcVar10 = "\tError occured during Initialization and serialize test of new objects phase.\n";
    }
    else {
      pcVar10 = "\tError occured during Initialization phase.\n";
    }
    (*(code *)**(undefined8 **)this->m_pLogger)(this->m_pLogger,pcVar10);
  default:
    goto switchD_00113247_default;
  }
  (*(code *)*puVar8)(pIVar11,pcVar10);
switchD_00113247_default:
  std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::operator=
            (&this->m_Constructors,&swapper->m_ConstructorsOld);
  if (swapper->m_ProtectedPhase != PHASE_SERIALIZEOUT) {
    (swapper->m_Serializer).m_bLoading = true;
    (swapper->m_Serializer).m_pCurrentObject = (IObject *)0x0;
    ppIVar5 = (this->m_Constructors).
              super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppIVar9 = (this->m_Constructors).
              super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar9 != ppIVar5) {
      uVar13 = 0;
      do {
        pIVar1 = ppIVar5[uVar13];
        lVar3 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
        if (lVar3 != 0) {
          uVar12 = 0;
          do {
            pObject = (IObject *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,uVar12);
            if (pObject != (IObject *)0x0) {
              SimpleSerializer::Serialize(&swapper->m_Serializer,pObject);
            }
            uVar12 = uVar12 + 1;
            uVar4 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
          } while (uVar12 < uVar4);
        }
        uVar13 = uVar13 + 1;
        ppIVar5 = (this->m_Constructors).
                  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppIVar9 = (this->m_Constructors).
                  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      } while (uVar13 < (ulong)((long)ppIVar9 - (long)ppIVar5 >> 3));
    }
    if (ppIVar9 != ppIVar5) {
      uVar13 = 0;
      do {
        pIVar1 = ppIVar5[uVar13];
        lVar3 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
        if (lVar3 != 0) {
          uVar12 = 0;
          do {
            plVar6 = (long *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,uVar12);
            if (plVar6 != (long *)0x0) {
              (**(code **)(*plVar6 + 0x18))(plVar6,0);
            }
            uVar12 = uVar12 + 1;
            uVar4 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
          } while (uVar12 < uVar4);
        }
        uVar13 = uVar13 + 1;
        ppIVar5 = (this->m_Constructors).
                  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(this->m_Constructors).
                                      super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5 >>
                               3));
    }
  }
LAB_001133a5:
  for (p_Var7 = *(_Rb_tree_node_base **)&this->field_0x68;
      p_Var7 != (_Rb_tree_node_base *)&this->field_0x58;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    (**(code **)**(undefined8 **)(p_Var7 + 1))();
  }
  return;
}

Assistant:

void ObjectFactorySystem::CompleteConstructorSwap( ProtectedObjectSwapper& swapper )
{
	if( swapper.HasHadException() && PHASE_DELETEOLD != swapper.m_ProtectedPhase )
	{
		if( m_pLogger )
		{
			m_pLogger->LogError( "Exception during object swapping, switching back to previous objects.\n" );
			switch( swapper.m_ProtectedPhase  )
			{
            case PHASE_NONE:
                AU_ASSERT( false );
                break;
			case PHASE_SERIALIZEOUT:
				m_pLogger->LogError( "\tError occured during serialize out old objects phase.\n" );
				break;
			case PHASE_CONSTRUCTNEW:
				m_pLogger->LogError( "\tError occured during constructing new objects phase.\n" );
				break;
			case PHASE_SERIALIZEIN:
				m_pLogger->LogError( "\tError occured during serialize into the new objects phase.\n" );
				break;
			case PHASE_AUTOCONSTRUCTSINGLETONS:
				m_pLogger->LogError( "\tError occured during auto construct singletons phase.\n" );
                break;
			case PHASE_INITANDSERIALIZEOUTTEST:
                if( m_bTestSerialization )
                {
				    m_pLogger->LogError( "\tError occured during Initialization and serialize test of new objects phase.\n" );
                }
                else
                {
				    m_pLogger->LogError( "\tError occured during Initialization phase.\n" );
                }
                break;
           case PHASE_DELETEOLD:
                break;
 			}
		}

		//swap back to new constructors before everything is serialized back in
		m_Constructors = swapper.m_ConstructorsOld;
		if( PHASE_SERIALIZEOUT != swapper.m_ProtectedPhase )
		{
			//serialize back with old objects - could cause exception which isn't handled, but hopefully not.
			swapper.m_Serializer.SetIsLoading( true );
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					// Iserialize new object
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						swapper.m_Serializer.Serialize( pObject );
					}			
				}
			}

			// Do a second pass, initializing objects now that they've all been serialized
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						pObject->Init(false);
					}			
				}
			}
		}
	}
	else
	{
		if( m_pLogger ) m_pLogger->LogInfo( "Object swap completed\n");
		if( swapper.HasHadException() && PHASE_DELETEOLD == swapper.m_ProtectedPhase )
		{
			if( m_pLogger ) m_pLogger->LogError( "Exception during object destruction of old objects, leaking.\n" );
		}
	}

	// Notify any listeners that constructors have changed
	TObjectFactoryListeners::iterator it = m_Listeners.begin();
	TObjectFactoryListeners::iterator itEnd = m_Listeners.end();
	while (it != itEnd)
	{
		(*it)->OnConstructorsAdded();
		++it;
	}
}